

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  StorageClass SVar2;
  int iVar3;
  size_t sVar4;
  Variant *pVVar5;
  pointer pcVar6;
  undefined8 uVar7;
  SPIRVariable *pSVar8;
  string *psVar9;
  undefined4 uVar10;
  CompilerMSL *pCVar11;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar12;
  char cVar13;
  bool bVar14;
  char cVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  SPIRVariable *pSVar18;
  size_type sVar19;
  MSLConstexprSampler *pMVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  SPIRVariable *pSVar23;
  SPIRType *pSVar24;
  long *plVar25;
  SPIRType *pSVar26;
  undefined8 *puVar27;
  Bitset *pBVar28;
  char *__lhs;
  runtime_error *prVar29;
  uint uVar30;
  long lVar31;
  size_type *psVar32;
  ulong *puVar33;
  ulong uVar34;
  uint uVar35;
  SPIRVariable *unaff_RBX;
  ID *__k;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar36;
  MSLConstexprSampler *pMVar37;
  undefined8 uVar38;
  ulong uVar39;
  _Alloc_hider _Var40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  uint uVar41;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var42;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar43;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *unaff_R15;
  long lVar44;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var45;
  Resource *pRVar46;
  byte bVar47;
  string __str;
  uint32_t var_id;
  string primary_name;
  char *cv_flags;
  __hashtable *__h;
  string __str_1;
  SmallVector<Resource,_8UL> resources;
  string local_410;
  string *local_3f0;
  string local_3e8;
  ID local_3c4;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [32];
  BaseType local_390;
  uint32_t local_38c;
  undefined8 local_388;
  CompilerMSL *local_380;
  string local_378;
  SPIRType *local_358;
  TypedID<(spirv_cross::Types)0> *local_350;
  size_t local_348;
  ulong local_340;
  long lStack_338;
  SPIRVariable *local_330;
  string local_328;
  SmallVector<spirv_cross::SPIRVariable_*,_8UL> *local_308;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_300;
  SPIRVariable *local_2f8;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_2f0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2e8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_2e0;
  ulong *local_2d8;
  uint local_2d0;
  undefined4 uStack_2cc;
  ulong local_2c8 [2];
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  ulong *local_298;
  long local_290;
  ulong local_288 [2];
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_278;
  ParsedIR *local_270;
  string local_268;
  undefined1 local_248 [536];
  
  bVar47 = 0;
  local_248._0_8_ = local_248 + 0x18;
  local_248._8_8_ = 0;
  local_248._16_8_ = 8;
  (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size = 0;
  local_270 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_3f0 = ep_args;
  ParsedIR::create_loop_hard_lock(local_270);
  sVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_380 = this;
  if (sVar4 != 0) {
    local_308 = &this->entry_point_bindings;
    unaff_R15 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)(this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_2f0 = unaff_R15 + sVar4 * 4;
    local_2f8 = (SPIRVariable *)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2e8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&this->constexpr_samplers_by_id;
    local_2e0 = &(this->atomic_image_vars_emulated)._M_h;
    local_278 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    do {
      uVar41 = *(uint *)unaff_R15;
      unaff_RBX = (SPIRVariable *)(ulong)uVar41;
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[(long)unaff_RBX].type == TypeVariable) {
        pSVar18 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + (long)unaff_RBX);
        local_3e8._M_dataplus._M_p._0_4_ = uVar41;
        if (((pSVar18->storage < (StorageClassStorageBuffer|StorageClassInput)) &&
            ((0x1205U >> (pSVar18->storage & 0x1f) & 1) != 0)) &&
           (bVar14 = Compiler::is_hidden_variable((Compiler *)this,pSVar18,false), !bVar14)) {
          local_358 = Compiler::get_variable_data_type((Compiler *)this,pSVar18);
          uVar16 = Compiler::get_decoration
                             ((Compiler *)this,local_3e8._M_dataplus._M_p._0_4_,
                              DecorationDescriptorSet);
          bVar14 = is_supported_argument_buffer_type(this,local_358);
          uVar38 = local_248._0_8_;
          SVar2 = pSVar18->storage;
          if (((SVar2 == StorageClassPushConstant || !bVar14) || (7 < uVar16)) ||
             (((this->msl_options).argument_buffers == false ||
              ((this->argument_buffer_discrete_mask >> (uVar16 & 0x1f) & 1) != 0)))) {
            local_300 = unaff_R15;
            if (((SVar2 == StorageClassStorageBuffer) || (SVar2 == StorageClassUniform)) &&
               (local_248._8_8_ != 0)) {
              lVar44 = local_248._8_8_ * 0x40;
              local_330 = (SPIRVariable *)0x0;
              lVar31 = 0;
              do {
                uVar16 = Compiler::get_decoration
                                   ((Compiler *)this,
                                    (ID)*(uint32_t *)
                                         (*(long *)((long)(SPIRVariable **)uVar38 + lVar31) + 8),
                                    DecorationDescriptorSet);
                uVar17 = Compiler::get_decoration
                                   ((Compiler *)this,local_3e8._M_dataplus._M_p._0_4_,
                                    DecorationDescriptorSet);
                pCVar11 = local_380;
                if (uVar16 == uVar17) {
                  uVar16 = Compiler::get_decoration
                                     ((Compiler *)local_380,
                                      (ID)*(uint32_t *)
                                           (*(long *)((long)(SPIRVariable **)uVar38 + lVar31) + 8),
                                      DecorationBinding);
                  uVar17 = Compiler::get_decoration
                                     ((Compiler *)pCVar11,local_3e8._M_dataplus._M_p._0_4_,
                                      DecorationBinding);
                  if (uVar16 != uVar17) goto LAB_001ec1f4;
                  bVar14 = false;
                  pSVar23 = local_330;
                  if ((*(int *)((long)(uVar38 + 0x30) + lVar31) == 0xf) &&
                     (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt == 0xf)) {
                    pSVar23 = *(SPIRVariable **)((long)(SPIRVariable **)uVar38 + lVar31);
                    iVar3 = *(int *)&(((string *)&pSVar23->storage)->_M_dataplus)._M_p;
                    if ((iVar3 != 0xc) && (iVar3 != 2)) goto LAB_001ec1f4;
                    *(SPIRVariable **)((long)(uVar38 + 8) + lVar31) = pSVar23;
                    sVar19 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)local_2f8,(key_type_conflict *)&local_3e8);
                    bVar14 = true;
                    if (sVar19 != 0) {
                      local_378._M_dataplus._M_p._0_4_ =
                           *(undefined4 *)(*(long *)((long)(SPIRVariable **)uVar38 + lVar31) + 8);
                      local_3c0._0_8_ = local_2f8;
                      ::std::
                      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      ::
                      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                  *)local_2f8,&local_378,local_3c0);
                    }
                  }
                }
                else {
LAB_001ec1f4:
                  bVar14 = false;
                  pSVar23 = local_330;
                }
                local_330 = pSVar23;
                this = local_380;
              } while ((!bVar14) &&
                      (bVar14 = lVar44 + -0x40 != lVar31, lVar31 = lVar31 + 0x40, bVar14));
            }
            else {
              local_330 = (SPIRVariable *)0x0;
            }
            if (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt - 0x11U < 2) {
              pMVar20 = find_constexpr_sampler(this,local_3e8._M_dataplus._M_p._0_4_);
              unaff_R15 = local_300;
              unaff_RBX = local_330;
              if (pMVar20 == (MSLConstexprSampler *)0x0) {
                pMVar20 = (MSLConstexprSampler *)0x0;
              }
              else {
                pmVar21 = ::std::
                          map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                          ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                        *)local_2e8,(key_type_conflict *)&local_3e8);
                pMVar37 = pMVar20;
                for (lVar31 = 0x19; lVar31 != 0; lVar31 = lVar31 + -1) {
                  pmVar21->coord = pMVar37->coord;
                  pMVar37 = (MSLConstexprSampler *)((long)pMVar37 + (ulong)bVar47 * -8 + 4);
                  pmVar21 = (mapped_type *)((long)pmVar21 + (ulong)bVar47 * -8 + 4);
                }
              }
            }
            else {
              pMVar20 = (MSLConstexprSampler *)0x0;
              unaff_RBX = local_330;
              unaff_R15 = local_300;
            }
            local_3c0._0_4_ = (pSVar18->super_IVariant).self.id;
            sVar19 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(local_2e0,(key_type_conflict *)local_3c0);
            if (sVar19 == 0) {
              uVar16 = 0;
            }
            else {
              uVar16 = get_metal_resource_index(this,pSVar18,AtomicCounter,0);
            }
            if (*(int *)&((__node_base *)&local_358->basetype)->_M_nxt == 0x11) {
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
              unaff_RBX = (SPIRVariable *)&DAT_00000001;
              if ((pMVar20 != (MSLConstexprSampler *)0x0) &&
                 (pMVar20->ycbcr_conversion_enable == true)) {
                unaff_RBX = (SPIRVariable *)(ulong)pMVar20->planes;
              }
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4]
                   = pSVar18;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar4 + 1;
              if ((uint32_t)unaff_RBX != 0) {
                uVar17 = 0;
                do {
                  local_3c0._8_8_ = local_330;
                  local_3c0._0_8_ = pSVar18;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            (local_3b0,this,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
                  local_390 = Image;
                  local_38c = get_metal_resource_index(this,pSVar18,Image,uVar17);
                  local_388 = CONCAT44(uVar16,uVar17);
                  SmallVector<Resource,_8UL>::push_back
                            ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3c0);
                  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                    operator_delete((void *)local_3b0._0_8_);
                  }
                  uVar17 = uVar17 + 1;
                } while ((uint32_t)unaff_RBX != uVar17);
              }
              unaff_R15 = local_300;
              if ((pMVar20 == (MSLConstexprSampler *)0x0) && ((local_358->image).dim != DimBuffer))
              {
                local_3c0._8_8_ = local_330;
                local_3c0._0_8_ = pSVar18;
                to_sampler_expression_abi_cxx11_
                          ((string *)local_3b0,this,local_3e8._M_dataplus._M_p._0_4_);
                local_390 = Sampler;
                local_38c = get_metal_resource_index(this,pSVar18,Sampler,0);
                local_388 = 0;
LAB_001ec509:
                SmallVector<Resource,_8UL>::push_back
                          ((SmallVector<Resource,_8UL> *)local_248,(Resource *)local_3c0);
                if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                  operator_delete((void *)local_3b0._0_8_);
                }
              }
            }
            else if (pMVar20 == (MSLConstexprSampler *)0x0) {
              CompilerGLSL::add_resource_name
                        (&this->super_CompilerGLSL,local_3e8._M_dataplus._M_p._0_4_);
              uVar17 = 0xffffffff;
              if (unaff_RBX == (SPIRVariable *)0x0) {
                uVar17 = get_metal_resource_index
                                   (this,pSVar18,
                                    *(BaseType *)&((__node_base *)&local_358->basetype)->_M_nxt,0);
              }
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4]
                   = pSVar18;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar4 + 1;
              local_3c0._0_8_ = pSVar18;
              local_3c0._8_8_ = unaff_RBX;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        (local_3b0,this,(ulong)local_3e8._M_dataplus._M_p & 0xffffffff,1);
              local_390 = *(BaseType *)&((__node_base *)&local_358->basetype)->_M_nxt;
              local_388 = (ulong)uVar16 << 0x20;
              local_38c = uVar17;
              goto LAB_001ec509;
            }
          }
          else {
            bVar14 = is_var_runtime_size_array(this,pSVar18);
            if (bVar14) {
              SmallVector<spirv_cross::SPIRVariable_*,_8UL>::reserve
                        (local_308,
                         (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                         buffer_size + 1);
              sVar4 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.
                      buffer_size;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr[sVar4]
                   = pSVar18;
              (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size
                   = sVar4 + 1;
              local_3c0._0_4_ = local_3e8._M_dataplus._M_p._0_4_;
              pmVar22 = ::std::__detail::
                        _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[](local_278,(key_type *)local_3c0);
              (pmVar22->decoration).qualified_alias_explicit_override = true;
            }
          }
        }
      }
      unaff_R15 = unaff_R15 + 4;
    } while (unaff_R15 != local_2f0);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_410);
  uVar38 = local_248._0_8_;
  if (local_248._8_8_ != 0) {
    pRVar46 = (Resource *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    p_Var42 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)((local_248._8_8_ - ((long)(local_248._8_8_ + 1) >> 0x3f)) + 1 >> 1);
    if (0x1fffffffffffffe < (long)p_Var42) {
      p_Var42 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)0x1ffffffffffffff;
    }
    do {
      if ((long)p_Var42 < 1) {
        pSVar18 = (SPIRVariable *)0x0;
        p_Var45 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)0x0;
        break;
      }
      pSVar23 = (SPIRVariable *)operator_new((long)p_Var42 << 6,(nothrow_t *)&::std::nothrow);
      pSVar18 = pSVar23;
      p_Var45 = p_Var42;
      if (pSVar23 == (SPIRVariable *)0x0) {
        pSVar18 = unaff_RBX;
        p_Var45 = unaff_R15;
        if (p_Var42 ==
            (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)&DAT_00000001) {
          p_Var42 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)0x0;
        }
        else {
          p_Var42 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)((ulong)(p_Var42 + 1) >> 1);
        }
      }
      unaff_RBX = pSVar18;
      unaff_R15 = p_Var45;
    } while (pSVar23 == (SPIRVariable *)0x0);
    if (pSVar18 == (SPIRVariable *)0x0) {
      pSVar18 = (SPIRVariable *)0x0;
      p_Var45 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)0x0;
    }
    else if (p_Var45 !=
             (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)0x0) {
      pSVar23 = *(SPIRVariable **)(uVar38 + 8);
      (pSVar18->super_IVariant)._vptr_IVariant = (_func_int **)*(SPIRVariable **)uVar38;
      *(SPIRVariable **)&(pSVar18->super_IVariant).self = pSVar23;
      (((string *)&pSVar18->storage)->_M_dataplus)._M_p = (pointer)&pSVar18->dereference_chain;
      pcVar6 = (((string *)(uVar38 + 0x10))->_M_dataplus)._M_p;
      paVar43 = &((string *)(uVar38 + 0x10))->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 == paVar43) {
        uVar7 = *(undefined8 *)((long)&((string *)(uVar38 + 0x10))->field_2 + 8);
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar18->dereference_chain)->_M_allocated_capacity = paVar43->_M_allocated_capacity;
        *(undefined8 *)((long)&pSVar18->dereference_chain + 8) = uVar7;
      }
      else {
        (((string *)&pSVar18->storage)->_M_dataplus)._M_p = pcVar6;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar18->dereference_chain)->_M_allocated_capacity = paVar43->_M_allocated_capacity;
      }
      uVar10 = *(undefined4 *)((long)&((string *)(uVar38 + 0x10))->_M_string_length + 4);
      pSVar18->initializer = (ID)*(undefined4 *)&((string *)(uVar38 + 0x10))->_M_string_length;
      pSVar18->basevariable = (VariableID)uVar10;
      (((string *)(uVar38 + 0x10))->_M_dataplus)._M_p = (pointer)paVar43;
      ((string *)(uVar38 + 0x10))->_M_string_length = 0;
      (((string *)(uVar38 + 0x10))->field_2)._M_local_buf[0] = '\0';
      uVar7 = *(undefined8 *)(uVar38 + 0x38);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar18->dereference_chain)->_M_local_buf + 0x10) = *(undefined8 *)(uVar38 + 0x30);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&pSVar18->dereference_chain)->_M_local_buf + 0x18) = uVar7;
      pSVar23 = pSVar18;
      if (p_Var45 !=
          (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           *)&DAT_00000001) {
        lVar31 = (long)p_Var45 * 0x40 + -0x40;
        pSVar12 = &pSVar18->dependees;
        do {
          pSVar36 = pSVar12;
          *(undefined8 *)((long)(pSVar36 + -1) + 0x18) =
               *(undefined8 *)((long)(pSVar36 + -2) + 0x10);
          *(undefined8 *)((long)(pSVar36 + -1) + 0x20) =
               *(undefined8 *)((long)(pSVar36 + -2) + 0x18);
          *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> **)
           ((long)(pSVar36 + -1) + 0x28) = pSVar36;
          lVar44 = (long)(pSVar36 + -2) + 0x30;
          if (lVar44 == *(long *)((long)(pSVar36 + -2) + 0x20)) {
            sVar4 = *(size_t *)(pSVar36 + -1);
            (pSVar36->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr =
                 *(TypedID<(spirv_cross::Types)0> **)lVar44;
            (pSVar36->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).buffer_size =
                 sVar4;
          }
          else {
            *(long *)((long)(pSVar36 + -1) + 0x28) = *(long *)((long)(pSVar36 + -2) + 0x20);
            (pSVar36->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr =
                 *(TypedID<(spirv_cross::Types)0> **)((long)(pSVar36 + -2) + 0x30);
          }
          *(undefined8 *)((long)(pSVar36 + -1) + 0x30) =
               *(undefined8 *)((long)(pSVar36 + -2) + 0x28);
          *(long *)((long)(pSVar36 + -2) + 0x20) = lVar44;
          *(undefined8 *)((long)(pSVar36 + -2) + 0x28) = 0;
          *(undefined1 *)((long)(pSVar36 + -2) + 0x30) = 0;
          pSVar36->buffer_capacity = *(size_t *)((long)(pSVar36 + -1) + 8);
          *(undefined8 *)(pSVar36->stack_storage).aligned_char =
               *(undefined8 *)((long)(pSVar36 + -1) + 0x10);
          lVar31 = lVar31 + -0x40;
          pSVar12 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
                    ((long)(pSVar36 + 1) + 8);
        } while (lVar31 != 0);
        pSVar23 = (SPIRVariable *)((long)(pSVar36 + -1) + 0x18);
      }
      pSVar8 = *(SPIRVariable **)&(pSVar23->super_IVariant).self;
      *(SPIRVariable **)uVar38 = (SPIRVariable *)(pSVar23->super_IVariant)._vptr_IVariant;
      *(SPIRVariable **)(uVar38 + 8) = pSVar8;
      ::std::__cxx11::string::operator=((string *)(uVar38 + 0x10),(string *)&pSVar23->storage);
      uVar7 = *(undefined8 *)
               (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&pSVar23->dereference_chain)->_M_local_buf + 0x18);
      *(undefined8 *)(uVar38 + 0x30) =
           *(undefined8 *)
            (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pSVar23->dereference_chain)->_M_local_buf + 0x10);
      *(undefined8 *)(uVar38 + 0x38) = uVar7;
    }
    if (pSVar18 == (SPIRVariable *)0x0) {
      ::std::
      __inplace_stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar38,&pRVar46->var);
    }
    else {
      ::std::
      __stable_sort_adaptive<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>>
                (uVar38,&pRVar46->var,pSVar18,p_Var45);
    }
    if (p_Var45 !=
        (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         *)0x0) {
      lVar31 = (long)p_Var45 << 6;
      paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&pSVar18->dereference_chain;
      do {
        pcVar6 = (((string *)(paVar43 + -1))->_M_dataplus)._M_p;
        if (paVar43 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6) {
          operator_delete(pcVar6);
        }
        paVar43 = paVar43 + 4;
        lVar31 = lVar31 + -0x40;
      } while (lVar31 != 0);
    }
    operator_delete(pSVar18);
  }
  if (local_248._8_8_ != 0) {
    local_330 = (SPIRVariable *)(local_248._0_8_ + local_248._8_8_ * 0x40);
    local_2e0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_380->plane_name_suffix;
    local_358 = (SPIRType *)&(local_380->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_2f8 = (SPIRVariable *)&local_380->atomic_image_vars_emulated;
    local_300 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&(local_380->super_CompilerGLSL).super_Compiler.ir.meta;
    local_308 = (SmallVector<spirv_cross::SPIRVariable_*,_8UL> *)&local_380->buffer_aliases_discrete
    ;
    local_2e8 = &(local_380->recursive_inputs)._M_h;
    pRVar46 = (Resource *)local_248._0_8_;
    do {
      pSVar18 = pRVar46->var;
      pSVar24 = Compiler::get_variable_data_type((Compiler *)local_380,pSVar18);
      local_3c4.id = (pSVar18->super_IVariant).self.id;
      switch(pRVar46->basetype) {
      case Struct:
        __k = &(pSVar24->super_IVariant).self;
        pmVar22 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_300,__k);
        pCVar11 = local_380;
        if ((pmVar22->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
          if (pRVar46->discrete_descriptor_alias == (SPIRVariable *)0x0) {
            sVar4 = (pSVar24->array).super_VectorView<unsigned_int>.buffer_size;
            if (sVar4 == 0) {
              if (local_3f0->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              pCVar11 = local_380;
              pSVar26 = Variant::get<spirv_cross::SPIRType>
                                  ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   *(uint *)&(pSVar18->super_IVariant).field_0xc);
              get_type_address_space_abi_cxx11_
                        (&local_410,pCVar11,pSVar26,(pSVar18->super_IVariant).self.id,true);
              plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
              local_3c0._0_8_ = local_3b0;
              pSVar18 = (SPIRVariable *)(plVar25 + 2);
              paVar43 = &local_410.field_2;
              if ((SPIRVariable *)*plVar25 == pSVar18) {
                local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                local_3b0._8_8_ = plVar25[3];
              }
              else {
                local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                local_3c0._0_8_ = (SPIRVariable *)*plVar25;
              }
              local_3c0._8_8_ = plVar25[1];
              *plVar25 = (long)pSVar18;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
              if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                operator_delete((void *)local_3c0._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar43) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              local_3c0._0_4_ = __k->id;
              sVar19 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count(local_2e8,(key_type_conflict *)local_3c0);
              if (sVar19 == 0) {
                (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_378,local_380,pSVar24,0);
                puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_378);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                puVar33 = puVar27 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar27 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar33) {
                  local_3e8.field_2._M_allocated_capacity = *puVar33;
                  local_3e8.field_2._8_8_ = puVar27[3];
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *puVar33;
                  local_3e8._M_dataplus._M_p = (pointer)*puVar27;
                }
                local_3e8._M_string_length = puVar27[1];
                *puVar27 = puVar33;
                puVar27[1] = 0;
                *(undefined1 *)(puVar27 + 2) = 0;
                to_restrict(local_380,local_3c4.id,true);
                puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
                psVar32 = puVar27 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar27 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar32) {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410.field_2._8_8_ = puVar27[3];
                  local_410._M_dataplus._M_p = (pointer)paVar43;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410._M_dataplus._M_p = (pointer)*puVar27;
                }
                local_410._M_string_length = puVar27[1];
                *puVar27 = psVar32;
                puVar27[1] = 0;
                *(undefined1 *)(puVar27 + 2) = 0;
                plVar25 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_410,
                                             (ulong)(pRVar46->name)._M_dataplus._M_p);
                local_3c0._0_8_ = local_3b0;
                pSVar18 = (SPIRVariable *)(plVar25 + 2);
                if ((SPIRVariable *)*plVar25 == pSVar18) {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar25[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                }
                local_3c0._8_8_ = plVar25[1];
                *plVar25 = (long)pSVar18;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
              }
              else {
                local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"void* ","");
                to_restrict(local_380,local_3c4.id,true);
                puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_378);
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                puVar33 = puVar27 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar27 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar33) {
                  local_3e8.field_2._M_allocated_capacity = *puVar33;
                  local_3e8.field_2._8_8_ = puVar27[3];
                }
                else {
                  local_3e8.field_2._M_allocated_capacity = *puVar33;
                  local_3e8._M_dataplus._M_p = (pointer)*puVar27;
                }
                local_3e8._M_string_length = puVar27[1];
                *puVar27 = puVar33;
                puVar27[1] = 0;
                *(undefined1 *)(puVar27 + 2) = 0;
                plVar25 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_3e8,
                                             (ulong)(pRVar46->name)._M_dataplus._M_p);
                psVar32 = (size_type *)(plVar25 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar25 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar32) {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410.field_2._8_8_ = plVar25[3];
                  local_410._M_dataplus._M_p = (pointer)paVar43;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410._M_dataplus._M_p = (pointer)*plVar25;
                }
                local_410._M_string_length = plVar25[1];
                *plVar25 = (long)psVar32;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3c0._0_8_ = local_3b0;
                pSVar18 = (SPIRVariable *)(plVar25 + 2);
                if ((SPIRVariable *)*plVar25 == pSVar18) {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar25[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                }
                local_3c0._8_8_ = plVar25[1];
                *plVar25 = (long)pSVar18;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
              }
              if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                operator_delete((void *)local_3c0._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar43) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              uVar41 = pRVar46->index;
              cVar15 = '\x01';
              if (9 < uVar41) {
                uVar35 = uVar41;
                cVar13 = '\x04';
                do {
                  cVar15 = cVar13;
                  if (uVar35 < 100) {
                    cVar15 = cVar15 + -2;
                    goto LAB_001ef81e;
                  }
                  if (uVar35 < 1000) {
                    cVar15 = cVar15 + -1;
                    goto LAB_001ef81e;
                  }
                  if (uVar35 < 10000) goto LAB_001ef81e;
                  bVar14 = 99999 < uVar35;
                  uVar35 = uVar35 / 10000;
                  cVar13 = cVar15 + '\x04';
                } while (bVar14);
                cVar15 = cVar15 + '\x01';
              }
LAB_001ef81e:
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
              puVar27 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
              psVar32 = puVar27 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar27 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410.field_2._8_8_ = puVar27[3];
                local_410._M_dataplus._M_p = (pointer)paVar43;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410._M_dataplus._M_p = (pointer)*puVar27;
              }
              local_410._M_string_length = puVar27[1];
              *puVar27 = psVar32;
              puVar27[1] = 0;
              *(undefined1 *)(puVar27 + 2) = 0;
              plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
              local_3c0._0_8_ = local_3b0;
              pSVar18 = (SPIRVariable *)(plVar25 + 2);
              if ((SPIRVariable *)*plVar25 == pSVar18) {
                local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                local_3b0._8_8_ = plVar25[3];
              }
              else {
                local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                local_3c0._0_8_ = (SPIRVariable *)*plVar25;
              }
              local_3c0._8_8_ = plVar25[1];
              *plVar25 = (long)pSVar18;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
              if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                operator_delete((void *)local_3c0._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar43) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              sVar19 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_358,&local_3c4.id);
              if (sVar19 != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              ::std::__cxx11::string::append((char *)local_3f0);
            }
            else {
              if (sVar4 != 1) {
                prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error
                          (prVar29,"Arrays of arrays of buffers are not supported.");
                *(undefined ***)prVar29 = &PTR__runtime_error_003a8f30;
                __cxa_throw(prVar29,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              local_380->is_using_builtin_array = true;
              bVar14 = is_var_runtime_size_array(local_380,pSVar18);
              if (bVar14) {
                add_spv_func_and_recompile(local_380,SPVFuncImplVariableDescriptorArray);
                if (local_3f0->_M_string_length != 0) {
                  ::std::__cxx11::string::append((char *)local_3f0);
                }
                bVar14 = Compiler::has_decoration
                                   ((Compiler *)local_380,(ID)__k->id,DecorationBufferBlock);
                pCVar11 = local_380;
                if (((~bVar14 & pSVar18->storage != StorageClassStorageBuffer) == 0) &&
                   ((local_380->msl_options).runtime_array_rich_descriptor == true)) {
                  add_spv_func_and_recompile(local_380,SPVFuncImplVariableSizedDescriptor);
                  pCVar11 = local_380;
                  pSVar26 = Variant::get<spirv_cross::SPIRType>
                                      ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       *(uint *)&(pSVar18->super_IVariant).field_0xc);
                  get_type_address_space_abi_cxx11_
                            (&local_328,pCVar11,pSVar26,(pSVar18->super_IVariant).self.id,true);
                  puVar27 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_328,0,(char *)0x0,0x30648a);
                  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                  puVar33 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar33) {
                    local_378.field_2._M_allocated_capacity = *puVar33;
                    local_378.field_2._8_8_ = puVar27[3];
                  }
                  else {
                    local_378.field_2._M_allocated_capacity = *puVar33;
                    local_378._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_378._M_string_length = puVar27[1];
                  *puVar27 = puVar33;
                  puVar27[1] = 0;
                  *(undefined1 *)(puVar27 + 2) = 0;
                  puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_378);
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                  puVar33 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar33) {
                    local_3e8.field_2._M_allocated_capacity = *puVar33;
                    local_3e8.field_2._8_8_ = puVar27[3];
                  }
                  else {
                    local_3e8.field_2._M_allocated_capacity = *puVar33;
                    local_3e8._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_3e8._M_string_length = puVar27[1];
                  *puVar27 = puVar33;
                  puVar27[1] = 0;
                  *(undefined1 *)(puVar27 + 2) = 0;
                  (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_350,local_380,pSVar24,0);
                  uVar38 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                    uVar38 = local_3e8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar38 < local_348 + local_3e8._M_string_length) {
                    uVar34 = 0xf;
                    if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
                      uVar34 = local_340;
                    }
                    if (uVar34 < local_348 + local_3e8._M_string_length) goto LAB_001efb2e;
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_350,0,(char *)0x0,
                                         (ulong)local_3e8._M_dataplus._M_p);
                  }
                  else {
LAB_001efb2e:
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_350)
                    ;
                  }
                  psVar32 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar32) {
                    local_410.field_2._M_allocated_capacity = *psVar32;
                    local_410.field_2._8_8_ = puVar27[3];
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                  }
                  else {
                    local_410.field_2._M_allocated_capacity = *psVar32;
                    local_410._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_410._M_string_length = puVar27[1];
                  *puVar27 = psVar32;
                  puVar27[1] = 0;
                  *(undefined1 *)psVar32 = 0;
                  plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                  local_3c0._0_8_ = local_3b0;
                  pSVar18 = (SPIRVariable *)(plVar25 + 2);
                  if ((SPIRVariable *)*plVar25 == pSVar18) {
                    local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar25[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                  }
                  local_3c0._8_8_ = plVar25[1];
                  *plVar25 = (long)pSVar18;
                  plVar25[1] = 0;
                  *(undefined1 *)(plVar25 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                }
                else {
                  pSVar26 = Variant::get<spirv_cross::SPIRType>
                                      ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       *(uint *)&(pSVar18->super_IVariant).field_0xc);
                  get_type_address_space_abi_cxx11_
                            (&local_328,pCVar11,pSVar26,(pSVar18->super_IVariant).self.id,true);
                  puVar27 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_328,0,(char *)0x0,0x3064b1);
                  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                  puVar33 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar33) {
                    local_378.field_2._M_allocated_capacity = *puVar33;
                    local_378.field_2._8_8_ = puVar27[3];
                  }
                  else {
                    local_378.field_2._M_allocated_capacity = *puVar33;
                    local_378._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_378._M_string_length = puVar27[1];
                  *puVar27 = puVar33;
                  puVar27[1] = 0;
                  *(undefined1 *)(puVar27 + 2) = 0;
                  puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_378);
                  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                  puVar33 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar33) {
                    local_3e8.field_2._M_allocated_capacity = *puVar33;
                    local_3e8.field_2._8_8_ = puVar27[3];
                  }
                  else {
                    local_3e8.field_2._M_allocated_capacity = *puVar33;
                    local_3e8._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_3e8._M_string_length = puVar27[1];
                  *puVar27 = puVar33;
                  puVar27[1] = 0;
                  *(undefined1 *)(puVar27 + 2) = 0;
                  (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                            (&local_350,local_380,pSVar24,0);
                  uVar38 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                    uVar38 = local_3e8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar38 < local_348 + local_3e8._M_string_length) {
                    uVar34 = 0xf;
                    if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
                      uVar34 = local_340;
                    }
                    if (uVar34 < local_348 + local_3e8._M_string_length) goto LAB_001ef6da;
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_350,0,(char *)0x0,
                                         (ulong)local_3e8._M_dataplus._M_p);
                  }
                  else {
LAB_001ef6da:
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_350)
                    ;
                  }
                  psVar32 = puVar27 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar27 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar32) {
                    local_410.field_2._M_allocated_capacity = *psVar32;
                    local_410.field_2._8_8_ = puVar27[3];
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                  }
                  else {
                    local_410.field_2._M_allocated_capacity = *psVar32;
                    local_410._M_dataplus._M_p = (pointer)*puVar27;
                  }
                  local_410._M_string_length = puVar27[1];
                  *puVar27 = psVar32;
                  puVar27[1] = 0;
                  *(undefined1 *)psVar32 = 0;
                  plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                  local_3c0._0_8_ = local_3b0;
                  pSVar18 = (SPIRVariable *)(plVar25 + 2);
                  if ((SPIRVariable *)*plVar25 == pSVar18) {
                    local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                    local_3b0._8_8_ = plVar25[3];
                  }
                  else {
                    local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                    local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                  }
                  local_3c0._8_8_ = plVar25[1];
                  *plVar25 = (long)pSVar18;
                  plVar25[1] = 0;
                  *(undefined1 *)(plVar25 + 2) = 0;
                  ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                }
                paVar43 = &local_410.field_2;
                if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar43) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
                  operator_delete(local_350);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_378._M_dataplus._M_p != &local_378.field_2) {
                  operator_delete(local_378._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._M_dataplus._M_p != &local_328.field_2) {
                  operator_delete(local_328._M_dataplus._M_p);
                }
                __lhs = to_restrict(local_380,local_3c4.id,true);
                ::std::operator+(&local_410,__lhs,&pRVar46->name);
                plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3c0._0_8_ = local_3b0;
                pSVar18 = (SPIRVariable *)(plVar25 + 2);
                if ((SPIRVariable *)*plVar25 == pSVar18) {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar25[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                }
                local_3c0._8_8_ = plVar25[1];
                *plVar25 = (long)pSVar18;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar43) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                uVar41 = pRVar46->index;
                cVar15 = '\x01';
                if (9 < uVar41) {
                  uVar35 = uVar41;
                  cVar13 = '\x04';
                  do {
                    cVar15 = cVar13;
                    if (uVar35 < 100) {
                      cVar15 = cVar15 + -2;
                      goto LAB_001efd8e;
                    }
                    if (uVar35 < 1000) {
                      cVar15 = cVar15 + -1;
                      goto LAB_001efd8e;
                    }
                    if (uVar35 < 10000) goto LAB_001efd8e;
                    bVar14 = 99999 < uVar35;
                    uVar35 = uVar35 / 10000;
                    cVar13 = cVar15 + '\x04';
                  } while (bVar14);
                  cVar15 = cVar15 + '\x01';
                }
LAB_001efd8e:
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
                puVar27 = (undefined8 *)
                          ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
                psVar32 = puVar27 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar27 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar32) {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410.field_2._8_8_ = puVar27[3];
                  local_410._M_dataplus._M_p = (pointer)paVar43;
                }
                else {
                  local_410.field_2._M_allocated_capacity = *psVar32;
                  local_410._M_dataplus._M_p = (pointer)*puVar27;
                }
                local_410._M_string_length = puVar27[1];
                *puVar27 = psVar32;
                puVar27[1] = 0;
                *(undefined1 *)(puVar27 + 2) = 0;
                plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                local_3c0._0_8_ = local_3b0;
                pSVar18 = (SPIRVariable *)(plVar25 + 2);
                if ((SPIRVariable *)*plVar25 == pSVar18) {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3b0._8_8_ = plVar25[3];
                }
                else {
                  local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
                  local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                }
                local_3c0._8_8_ = plVar25[1];
                *plVar25 = (long)pSVar18;
                plVar25[1] = 0;
                *(undefined1 *)(plVar25 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                  operator_delete((void *)local_3c0._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_410._M_dataplus._M_p != paVar43) {
                  operator_delete(local_410._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p);
                }
                sVar19 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                  *)local_358,&local_3c4.id);
                if (sVar19 != 0) {
                  ::std::__cxx11::string::append((char *)local_3f0);
                }
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              else {
                uVar16 = get_resource_array_size(local_380,pSVar24,local_3c4.id);
                if (uVar16 != 0) {
                  uVar34 = 0;
                  local_2f0 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)CONCAT44(local_2f0._4_4_,uVar16);
                  do {
                    if (local_3f0->_M_string_length != 0) {
                      ::std::__cxx11::string::append((char *)local_3f0);
                    }
                    pCVar11 = local_380;
                    pSVar26 = Variant::get<spirv_cross::SPIRType>
                                        ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                                         super_VectorView<spirv_cross::Variant>.ptr +
                                         *(uint *)&(pSVar18->super_IVariant).field_0xc);
                    get_type_address_space_abi_cxx11_
                              (&local_268,pCVar11,pSVar26,(pSVar18->super_IVariant).self.id,true);
                    plVar25 = (long *)::std::__cxx11::string::append((char *)&local_268);
                    local_2b8 = &local_2a8;
                    puVar33 = (ulong *)(plVar25 + 2);
                    if ((ulong *)*plVar25 == puVar33) {
                      local_2a8 = *puVar33;
                      uStack_2a0 = (undefined4)plVar25[3];
                      uStack_29c = *(undefined4 *)((long)plVar25 + 0x1c);
                    }
                    else {
                      local_2a8 = *puVar33;
                      local_2b8 = (ulong *)*plVar25;
                    }
                    local_2b0 = plVar25[1];
                    *plVar25 = (long)puVar33;
                    plVar25[1] = 0;
                    *(undefined1 *)(plVar25 + 2) = 0;
                    (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                              (&local_298,local_380,pSVar24,0);
                    uVar39 = 0xf;
                    if (local_2b8 != &local_2a8) {
                      uVar39 = local_2a8;
                    }
                    if (uVar39 < (ulong)(local_290 + local_2b0)) {
                      uVar39 = 0xf;
                      if (local_298 != local_288) {
                        uVar39 = local_288[0];
                      }
                      if (uVar39 < (ulong)(local_290 + local_2b0)) goto LAB_001ee263;
                      plVar25 = (long *)::std::__cxx11::string::replace
                                                  ((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8)
                      ;
                    }
                    else {
LAB_001ee263:
                      plVar25 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_2b8,(ulong)local_298);
                    }
                    local_350 = (TypedID<(spirv_cross::Types)0> *)&local_340;
                    pTVar1 = (TypedID<(spirv_cross::Types)0> *)(plVar25 + 2);
                    if ((TypedID<(spirv_cross::Types)0> *)*plVar25 == pTVar1) {
                      local_340 = *(ulong *)pTVar1;
                      lStack_338 = plVar25[3];
                    }
                    else {
                      local_340 = *(ulong *)pTVar1;
                      local_350 = (TypedID<(spirv_cross::Types)0> *)*plVar25;
                    }
                    local_348 = plVar25[1];
                    *plVar25 = (long)pTVar1;
                    plVar25[1] = 0;
                    *(undefined1 *)&pTVar1->id = 0;
                    puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_350);
                    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                    psVar32 = puVar27 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar32) {
                      local_328.field_2._M_allocated_capacity = *psVar32;
                      local_328.field_2._8_8_ = puVar27[3];
                    }
                    else {
                      local_328.field_2._M_allocated_capacity = *psVar32;
                      local_328._M_dataplus._M_p = (pointer)*puVar27;
                    }
                    local_328._M_string_length = puVar27[1];
                    *puVar27 = psVar32;
                    puVar27[1] = 0;
                    *(undefined1 *)(puVar27 + 2) = 0;
                    to_restrict(local_380,local_3c4.id,true);
                    puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_328);
                    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
                    puVar33 = puVar27 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar33) {
                      local_378.field_2._M_allocated_capacity = *puVar33;
                      local_378.field_2._8_8_ = puVar27[3];
                    }
                    else {
                      local_378.field_2._M_allocated_capacity = *puVar33;
                      local_378._M_dataplus._M_p = (pointer)*puVar27;
                    }
                    local_378._M_string_length = puVar27[1];
                    *puVar27 = puVar33;
                    puVar27[1] = 0;
                    *(undefined1 *)(puVar27 + 2) = 0;
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_378,(ulong)(pRVar46->name)._M_dataplus._M_p)
                    ;
                    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                    puVar33 = puVar27 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar33) {
                      local_3e8.field_2._M_allocated_capacity = *puVar33;
                      local_3e8.field_2._8_8_ = puVar27[3];
                    }
                    else {
                      local_3e8.field_2._M_allocated_capacity = *puVar33;
                      local_3e8._M_dataplus._M_p = (pointer)*puVar27;
                    }
                    local_3e8._M_string_length = puVar27[1];
                    *puVar27 = puVar33;
                    puVar27[1] = 0;
                    *(undefined1 *)(puVar27 + 2) = 0;
                    plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                    puVar33 = (ulong *)(plVar25 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar25 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar33) {
                      local_410.field_2._M_allocated_capacity = *puVar33;
                      local_410.field_2._8_8_ = plVar25[3];
                    }
                    else {
                      local_410.field_2._M_allocated_capacity = *puVar33;
                      local_410._M_dataplus._M_p = (pointer)*plVar25;
                    }
                    local_410._M_string_length = plVar25[1];
                    *plVar25 = (long)puVar33;
                    plVar25[1] = 0;
                    *(undefined1 *)(plVar25 + 2) = 0;
                    cVar15 = '\x01';
                    uVar41 = (uint)uVar34;
                    if (9 < uVar41) {
                      cVar13 = '\x04';
                      do {
                        cVar15 = cVar13;
                        uVar35 = (uint)uVar34;
                        if (uVar35 < 100) {
                          cVar15 = cVar15 + -2;
                          goto LAB_001ee4c8;
                        }
                        if (uVar35 < 1000) {
                          cVar15 = cVar15 + -1;
                          goto LAB_001ee4c8;
                        }
                        if (uVar35 < 10000) goto LAB_001ee4c8;
                        uVar34 = uVar34 / 10000;
                        cVar13 = cVar15 + '\x04';
                      } while (99999 < uVar35);
                      cVar15 = cVar15 + '\x01';
                    }
LAB_001ee4c8:
                    local_2d8 = local_2c8;
                    ::std::__cxx11::string::_M_construct((ulong)&local_2d8,cVar15);
                    ::std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)local_2d8,local_2d0,uVar41);
                    uVar38 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      uVar38 = local_410.field_2._M_allocated_capacity;
                    }
                    uVar34 = CONCAT44(uStack_2cc,local_2d0) + local_410._M_string_length;
                    if ((ulong)uVar38 < uVar34) {
                      uVar39 = 0xf;
                      if (local_2d8 != local_2c8) {
                        uVar39 = local_2c8[0];
                      }
                      if (uVar39 < uVar34) goto LAB_001ee553;
                      plVar25 = (long *)::std::__cxx11::string::replace
                                                  ((ulong)&local_2d8,0,(char *)0x0,
                                                   (ulong)local_410._M_dataplus._M_p);
                    }
                    else {
LAB_001ee553:
                      plVar25 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_410,(ulong)local_2d8);
                    }
                    local_3c0._0_8_ = local_3b0;
                    pSVar23 = (SPIRVariable *)(plVar25 + 2);
                    if ((SPIRVariable *)*plVar25 == pSVar23) {
                      local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
                      local_3b0._8_8_ = plVar25[3];
                    }
                    else {
                      local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
                      local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                    }
                    local_3c0._8_8_ = plVar25[1];
                    *plVar25 = (long)pSVar23;
                    plVar25[1] = 0;
                    *(undefined1 *)&(pSVar23->super_IVariant)._vptr_IVariant = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                    if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                      operator_delete((void *)local_3c0._0_8_);
                    }
                    if (local_2d8 != local_2c8) {
                      operator_delete(local_2d8);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      operator_delete(local_410._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      operator_delete(local_3e8._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._M_dataplus._M_p != &local_378.field_2) {
                      operator_delete(local_378._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p != &local_328.field_2) {
                      operator_delete(local_328._M_dataplus._M_p);
                    }
                    if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
                      operator_delete(local_350);
                    }
                    if (local_298 != local_288) {
                      operator_delete(local_298);
                    }
                    if (local_2b8 != &local_2a8) {
                      operator_delete(local_2b8);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_268._M_dataplus._M_p != &local_268.field_2) {
                      operator_delete(local_268._M_dataplus._M_p);
                    }
                    uVar35 = pRVar46->index + uVar41;
                    cVar15 = '\x01';
                    if (9 < uVar35) {
                      uVar30 = uVar35;
                      cVar13 = '\x04';
                      do {
                        cVar15 = cVar13;
                        if (uVar30 < 100) {
                          cVar15 = cVar15 + -2;
                          goto LAB_001ee71b;
                        }
                        if (uVar30 < 1000) {
                          cVar15 = cVar15 + -1;
                          goto LAB_001ee71b;
                        }
                        if (uVar30 < 10000) goto LAB_001ee71b;
                        bVar14 = 99999 < uVar30;
                        uVar30 = uVar30 / 10000;
                        cVar13 = cVar15 + '\x04';
                      } while (bVar14);
                      cVar15 = cVar15 + '\x01';
                    }
LAB_001ee71b:
                    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                    ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
                    ::std::__detail::__to_chars_10_impl<unsigned_int>
                              (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar35);
                    puVar27 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
                    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
                    psVar32 = puVar27 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar27 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar32) {
                      local_410.field_2._M_allocated_capacity = *psVar32;
                      local_410.field_2._8_8_ = puVar27[3];
                    }
                    else {
                      local_410.field_2._M_allocated_capacity = *psVar32;
                      local_410._M_dataplus._M_p = (pointer)*puVar27;
                    }
                    uVar35 = (uint)local_2f0;
                    local_410._M_string_length = puVar27[1];
                    *puVar27 = psVar32;
                    puVar27[1] = 0;
                    *(undefined1 *)(puVar27 + 2) = 0;
                    plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
                    local_3c0._0_8_ = local_3b0;
                    pSVar23 = (SPIRVariable *)(plVar25 + 2);
                    if ((SPIRVariable *)*plVar25 == pSVar23) {
                      local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
                      local_3b0._8_8_ = plVar25[3];
                    }
                    else {
                      local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
                      local_3c0._0_8_ = (SPIRVariable *)*plVar25;
                    }
                    local_3c0._8_8_ = plVar25[1];
                    *plVar25 = (long)pSVar23;
                    plVar25[1] = 0;
                    *(undefined1 *)(plVar25 + 2) = 0;
                    ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
                    if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                      operator_delete((void *)local_3c0._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_410._M_dataplus._M_p != &local_410.field_2) {
                      operator_delete(local_410._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      operator_delete(local_3e8._M_dataplus._M_p);
                    }
                    sVar19 = ::std::
                             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                      *)local_358,&local_3c4.id);
                    if (sVar19 != 0) {
                      ::std::__cxx11::string::append((char *)local_3f0);
                    }
                    ::std::__cxx11::string::append((char *)local_3f0);
                    uVar34 = (ulong)(uVar41 + 1);
                  } while (uVar41 + 1 != uVar35);
                }
              }
              local_380->is_using_builtin_array = false;
            }
          }
          else {
            if (pRVar46->var == pRVar46->discrete_descriptor_alias) {
              uVar16 = Compiler::get_decoration
                                 ((Compiler *)local_380,local_3c4,DecorationDescriptorSet);
              local_410._M_dataplus._M_p._0_4_ = uVar16;
              uVar16 = Compiler::get_decoration((Compiler *)pCVar11,local_3c4,DecorationBinding);
              paVar43 = &local_410.field_2;
              local_3e8._M_dataplus._M_p._0_4_ = uVar16;
              join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                        ((string *)local_3c0,(spirv_cross *)"spvBufferAliasSet",
                         (char (*) [18])&local_410,(uint *)"Binding",(char (*) [8])&local_3e8,
                         (uint *)in_R9);
              if (local_3f0->_M_string_length != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              pCVar11 = local_380;
              pSVar24 = Variant::get<spirv_cross::SPIRType>
                                  ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   *(uint *)&(pSVar18->super_IVariant).field_0xc);
              get_type_address_space_abi_cxx11_
                        (&local_378,pCVar11,pSVar24,(pSVar18->super_IVariant).self.id,true);
              plVar25 = (long *)::std::__cxx11::string::append((char *)&local_378);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_3e8.field_2._M_allocated_capacity = *psVar32;
                local_3e8.field_2._8_8_ = plVar25[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *psVar32;
                local_3e8._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_3e8._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              plVar25 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_3e8,local_3c0._0_8_);
              psVar32 = (size_type *)(plVar25 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar25 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410.field_2._8_8_ = plVar25[3];
                local_410._M_dataplus._M_p = (pointer)paVar43;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410._M_dataplus._M_p = (pointer)*plVar25;
              }
              local_410._M_string_length = plVar25[1];
              *plVar25 = (long)psVar32;
              plVar25[1] = 0;
              *(undefined1 *)(plVar25 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_410._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar43) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              uVar41 = pRVar46->index;
              cVar15 = '\x01';
              if (9 < uVar41) {
                uVar35 = uVar41;
                cVar13 = '\x04';
                do {
                  cVar15 = cVar13;
                  if (uVar35 < 100) {
                    cVar15 = cVar15 + -2;
                    goto LAB_001ef3b3;
                  }
                  if (uVar35 < 1000) {
                    cVar15 = cVar15 + -1;
                    goto LAB_001ef3b3;
                  }
                  if (uVar35 < 10000) goto LAB_001ef3b3;
                  bVar14 = 99999 < uVar35;
                  uVar35 = uVar35 / 10000;
                  cVar13 = cVar15 + '\x04';
                } while (bVar14);
                cVar15 = cVar15 + '\x01';
              }
LAB_001ef3b3:
              local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_378,cVar15);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_378._M_dataplus._M_p,(uint)local_378._M_string_length,uVar41);
              puVar27 = (undefined8 *)
                        ::std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,0x3064ce);
              local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
              puVar33 = puVar27 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar27 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar33) {
                local_3e8.field_2._M_allocated_capacity = *puVar33;
                local_3e8.field_2._8_8_ = puVar27[3];
              }
              else {
                local_3e8.field_2._M_allocated_capacity = *puVar33;
                local_3e8._M_dataplus._M_p = (pointer)*puVar27;
              }
              local_3e8._M_string_length = puVar27[1];
              *puVar27 = puVar33;
              puVar27[1] = 0;
              *(undefined1 *)(puVar27 + 2) = 0;
              puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
              psVar32 = puVar27 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar27 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar32) {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410.field_2._8_8_ = puVar27[3];
                local_410._M_dataplus._M_p = (pointer)paVar43;
              }
              else {
                local_410.field_2._M_allocated_capacity = *psVar32;
                local_410._M_dataplus._M_p = (pointer)*puVar27;
              }
              local_410._M_string_length = puVar27[1];
              *puVar27 = psVar32;
              puVar27[1] = 0;
              *(undefined1 *)(puVar27 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_3f0,(ulong)local_410._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_410._M_dataplus._M_p != paVar43) {
                operator_delete(local_410._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                operator_delete(local_3e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._M_dataplus._M_p != &local_378.field_2) {
                operator_delete(local_378._M_dataplus._M_p);
              }
              sVar19 = ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                *)local_358,&local_3c4.id);
              if (sVar19 != 0) {
                ::std::__cxx11::string::append((char *)local_3f0);
              }
              ::std::__cxx11::string::append((char *)local_3f0);
              if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
                operator_delete((void *)local_3c0._0_8_);
              }
            }
            pCVar11 = local_380;
            uVar41 = (pRVar46->var->super_IVariant).self.id;
            SmallVector<unsigned_int,_8UL>::reserve
                      ((SmallVector<unsigned_int,_8UL> *)local_308,
                       (local_380->buffer_aliases_discrete).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar4 = (pCVar11->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
            (pCVar11->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr[sVar4] = uVar41;
            (pCVar11->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size =
                 sVar4 + 1;
          }
        }
        break;
      case Image:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        pSVar26 = Variant::get<spirv_cross::SPIRType>
                            ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar18->super_IVariant).field_0xc);
        if (((pSVar26->basetype == Image) && ((pSVar26->image).dim == DimSubpassData)) &&
           ((local_380->msl_options).use_framebuffer_fetch_subpasses != false)) {
          if (((local_380->msl_options).platform == macOS) &&
             ((local_380->msl_options).msl_version < 0x4f4c)) {
            prVar29 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar29,"Framebuffer fetch on Mac is not supported before MSL 2.3.");
            *(undefined ***)prVar29 = &PTR__runtime_error_003a8f30;
            __cxa_throw(prVar29,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,local_380,pSVar24,(ulong)local_3c4.id,0);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar32 = (size_type *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = plVar25[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_410._M_string_length = plVar25[1];
          *plVar25 = (long)psVar32;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
          local_3c0._0_8_ = local_3b0;
          pSVar23 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar23) {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar23;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          uVar41 = pRVar46->index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001ef18b;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001ef18b;
              }
              if (uVar35 < 10000) goto LAB_001ef18b;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001ef18b:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3062c2);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar23 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar23) {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar23;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
        }
        else {
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                    (&local_3e8,local_380,pSVar24,(ulong)local_3c4.id,0);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          psVar32 = (size_type *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = plVar25[3];
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_410._M_string_length = plVar25[1];
          *plVar25 = (long)psVar32;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
          local_3c0._0_8_ = local_3b0;
          pSVar23 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar23) {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar23;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if (pRVar46->plane != 0) {
            join<std::__cxx11::string&,unsigned_int&>
                      ((string *)local_3c0,(spirv_cross *)local_2e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pRVar46->plane,(uint *)pSVar23);
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
            if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
              operator_delete((void *)local_3c0._0_8_);
            }
          }
          bVar14 = is_var_runtime_size_array(local_380,pSVar18);
          if (bVar14) {
            uVar41 = pRVar46->index;
            cVar15 = '\x01';
            if (9 < uVar41) {
              uVar35 = uVar41;
              cVar13 = '\x04';
              do {
                cVar15 = cVar13;
                if (uVar35 < 100) {
                  cVar15 = cVar15 + -2;
                  goto LAB_001ee9d4;
                }
                if (uVar35 < 1000) {
                  cVar15 = cVar15 + -1;
                  goto LAB_001ee9d4;
                }
                if (uVar35 < 10000) goto LAB_001ee9d4;
                bVar14 = 99999 < uVar35;
                uVar35 = uVar35 / 10000;
                cVar13 = cVar15 + '\x04';
              } while (bVar14);
              cVar15 = cVar15 + '\x01';
            }
LAB_001ee9d4:
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
            puVar27 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064cd);
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            psVar32 = puVar27 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar27 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar32) {
              local_410.field_2._M_allocated_capacity = *psVar32;
              local_410.field_2._8_8_ = puVar27[3];
            }
            else {
              local_410.field_2._M_allocated_capacity = *psVar32;
              local_410._M_dataplus._M_p = (pointer)*puVar27;
            }
            local_410._M_string_length = puVar27[1];
            *puVar27 = psVar32;
            puVar27[1] = 0;
            *(undefined1 *)(puVar27 + 2) = 0;
            plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
            local_3c0._0_8_ = local_3b0;
            pSVar23 = (SPIRVariable *)(plVar25 + 2);
            if ((SPIRVariable *)*plVar25 == pSVar23) {
              local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar25[3];
            }
            else {
              local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar25;
            }
            local_3c0._8_8_ = plVar25[1];
            *plVar25 = (long)pSVar23;
            plVar25[1] = 0;
            *(undefined1 *)(plVar25 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          }
          else {
            uVar41 = pRVar46->index;
            cVar15 = '\x01';
            if (9 < uVar41) {
              uVar35 = uVar41;
              cVar13 = '\x04';
              do {
                cVar15 = cVar13;
                if (uVar35 < 100) {
                  cVar15 = cVar15 + -2;
                  goto LAB_001eead6;
                }
                if (uVar35 < 1000) {
                  cVar15 = cVar15 + -1;
                  goto LAB_001eead6;
                }
                if (uVar35 < 10000) goto LAB_001eead6;
                bVar14 = 99999 < uVar35;
                uVar35 = uVar35 / 10000;
                cVar13 = cVar15 + '\x04';
              } while (bVar14);
              cVar15 = cVar15 + '\x01';
            }
LAB_001eead6:
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
            puVar27 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064e5);
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
            psVar32 = puVar27 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar27 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar32) {
              local_410.field_2._M_allocated_capacity = *psVar32;
              local_410.field_2._8_8_ = puVar27[3];
            }
            else {
              local_410.field_2._M_allocated_capacity = *psVar32;
              local_410._M_dataplus._M_p = (pointer)*puVar27;
            }
            local_410._M_string_length = puVar27[1];
            *puVar27 = psVar32;
            puVar27[1] = 0;
            *(undefined1 *)(puVar27 + 2) = 0;
            plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
            local_3c0._0_8_ = local_3b0;
            pSVar23 = (SPIRVariable *)(plVar25 + 2);
            if ((SPIRVariable *)*plVar25 == pSVar23) {
              local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
              local_3b0._8_8_ = plVar25[3];
            }
            else {
              local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
              local_3c0._0_8_ = (SPIRVariable *)*plVar25;
            }
            local_3c0._8_8_ = plVar25[1];
            *plVar25 = (long)pSVar23;
            plVar25[1] = 0;
            *(undefined1 *)(plVar25 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          }
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar19 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_358,&local_3c4.id);
          if (sVar19 != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        local_3c0._0_4_ = (pSVar18->super_IVariant).self.id;
        sVar19 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_2f8,(key_type_conflict *)local_3c0);
        if (sVar19 != 0) {
          pBVar28 = ParsedIR::get_decoration_bitset(local_270,(ID)(pSVar18->super_IVariant).self.id)
          ;
          pCVar11 = local_380;
          local_378._M_dataplus._M_p = "volatile ";
          if ((pBVar28->lower & 0xa00000) == 0) {
            local_378._M_dataplus._M_p = "";
          }
          pSVar24 = Variant::get<spirv_cross::SPIRType>
                              ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + (pSVar26->image).type.id
                              );
          (*(pCVar11->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_410,pCVar11,pSVar24,0);
          paVar43 = &local_410.field_2;
          join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                    ((string *)local_3c0,(spirv_cross *)0x305b66,(char (*) [3])&local_378,
                     (char **)"device atomic_",(char (*) [15])&local_410,in_R9);
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar43) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          ::std::operator+(&local_410,"* ",&pRVar46->name);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar43) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          uVar41 = pRVar46->secondary_index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001eee2d;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001eee2d;
              }
              if (uVar35 < 10000) goto LAB_001eee2d;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001eee2d:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)paVar43;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar43) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          sVar19 = ::std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_358,&local_3c4.id);
          if (sVar19 != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        break;
      default:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        pCVar11 = local_380;
        if (pSVar24->pointer == false) {
          pSVar26 = Variant::get<spirv_cross::SPIRType>
                              ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar18->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_(&local_328,pCVar11,pSVar26,local_3c4.id,false);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_328);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          puVar33 = (ulong *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar33) {
            local_378.field_2._M_allocated_capacity = *puVar33;
            local_378.field_2._8_8_ = plVar25[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *puVar33;
            local_378._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_378._M_string_length = plVar25[1];
          *plVar25 = (long)puVar33;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,local_380,pSVar24,(ulong)local_3c4.id);
          uVar38 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            uVar38 = local_378.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar38 < local_348 + local_378._M_string_length) {
            uVar34 = 0xf;
            if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
              uVar34 = local_340;
            }
            if (uVar34 < local_348 + local_378._M_string_length) goto LAB_001ed3ec;
            puVar27 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_350,0,(char *)0x0,(ulong)local_378._M_dataplus._M_p);
          }
          else {
LAB_001ed3ec:
            puVar27 = (undefined8 *)
                      ::std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_350);
          }
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          puVar33 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar33) {
            local_3e8.field_2._M_allocated_capacity = *puVar33;
            local_3e8.field_2._8_8_ = puVar27[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = *puVar33;
            local_3e8._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_3e8._M_string_length = puVar27[1];
          *puVar27 = puVar33;
          puVar27[1] = 0;
          *(undefined1 *)puVar33 = 0;
          puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_3e8);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
            operator_delete(local_350);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          psVar9 = &local_328;
          _Var40._M_p = local_328._M_dataplus._M_p;
        }
        else {
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_3e8,local_380,pSVar24,(ulong)local_3c4.id);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          psVar32 = (size_type *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = plVar25[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_410._M_string_length = plVar25[1];
          *plVar25 = (long)psVar32;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != &local_410.field_2) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          psVar9 = &local_3e8;
          _Var40._M_p = local_3e8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var40._M_p != &psVar9->field_2) {
          operator_delete(_Var40._M_p);
        }
        uVar41 = pRVar46->index;
        cVar15 = '\x01';
        if (9 < uVar41) {
          uVar35 = uVar41;
          cVar13 = '\x04';
          do {
            cVar15 = cVar13;
            if (uVar35 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_001ed9b6;
            }
            if (uVar35 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_001ed9b6;
            }
            if (uVar35 < 10000) goto LAB_001ed9b6;
            bVar14 = 99999 < uVar35;
            uVar35 = uVar35 / 10000;
            cVar13 = cVar15 + '\x04';
          } while (bVar14);
          cVar15 = cVar15 + '\x01';
        }
LAB_001ed9b6:
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
        plVar25 = (long *)::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
        psVar32 = (size_type *)(plVar25 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar25 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar32) {
          local_410.field_2._M_allocated_capacity = *psVar32;
          local_410.field_2._8_8_ = plVar25[3];
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar32;
          local_410._M_dataplus._M_p = (pointer)*plVar25;
        }
        local_410._M_string_length = plVar25[1];
        *plVar25 = (long)psVar32;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
        local_3c0._0_8_ = local_3b0;
        pSVar18 = (SPIRVariable *)(plVar25 + 2);
        if ((SPIRVariable *)*plVar25 == pSVar18) {
          local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
          local_3b0._8_8_ = plVar25[3];
        }
        else {
          local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
          local_3c0._0_8_ = (SPIRVariable *)*plVar25;
        }
        local_3c0._8_8_ = plVar25[1];
        *plVar25 = (long)pSVar18;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
          operator_delete((void *)local_3c0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        sVar19 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)local_358,&local_3c4.id);
        if (sVar19 != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        ::std::__cxx11::string::append((char *)local_3f0);
        break;
      case Sampler:
        if (local_3f0->_M_string_length != 0) {
          ::std::__cxx11::string::append((char *)local_3f0);
        }
        sampler_type_abi_cxx11_(&local_3e8,local_380,pSVar24,local_3c4.id,false);
        plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
        psVar32 = (size_type *)(plVar25 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar25 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar32) {
          local_410.field_2._M_allocated_capacity = *psVar32;
          local_410.field_2._8_8_ = plVar25[3];
          local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        }
        else {
          local_410.field_2._M_allocated_capacity = *psVar32;
          local_410._M_dataplus._M_p = (pointer)*plVar25;
        }
        local_410._M_string_length = plVar25[1];
        *plVar25 = (long)psVar32;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        plVar25 = (long *)::std::__cxx11::string::_M_append
                                    ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
        local_3c0._0_8_ = local_3b0;
        pSVar23 = (SPIRVariable *)(plVar25 + 2);
        if ((SPIRVariable *)*plVar25 == pSVar23) {
          local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
          local_3b0._8_8_ = plVar25[3];
        }
        else {
          local_3b0._0_8_ = (pSVar23->super_IVariant)._vptr_IVariant;
          local_3c0._0_8_ = (SPIRVariable *)*plVar25;
        }
        local_3c0._8_8_ = plVar25[1];
        *plVar25 = (long)pSVar23;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
          operator_delete((void *)local_3c0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        bVar14 = is_var_runtime_size_array(local_380,pSVar18);
        if (bVar14) {
          uVar41 = pRVar46->index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001edcf9;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001edcf9;
              }
              if (uVar35 < 10000) goto LAB_001edcf9;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001edcf9:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064cd);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        }
        else {
          uVar41 = pRVar46->index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001edded;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001edded;
              }
              if (uVar35 < 10000) goto LAB_001edded;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001edded:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064d9);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        }
        goto LAB_001ee0c2;
      case AccelerationStructure:
        bVar14 = is_var_runtime_size_array(local_380,pSVar18);
        if (bVar14) {
          add_spv_func_and_recompile(local_380,SPVFuncImplVariableDescriptor);
          pSVar24 = Variant::get<spirv_cross::SPIRType>
                              ((local_380->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (pSVar24->parent_type).id);
          if (local_3f0->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_350,local_380,pSVar24,0);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,0x3064b1);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar32 = puVar27 + 2;
          paVar43 = &local_410.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_328.field_2._M_allocated_capacity = *psVar32;
            local_328.field_2._8_8_ = puVar27[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar32;
            local_328._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_328._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          puVar27 = (undefined8 *)::std::__cxx11::string::append((char *)&local_328);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          puVar33 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar33) {
            local_378.field_2._M_allocated_capacity = *puVar33;
            local_378.field_2._8_8_ = puVar27[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *puVar33;
            local_378._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_378._M_string_length = puVar27[1];
          *puVar27 = puVar33;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          to_restrict(local_380,local_3c4.id,true);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_378);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          puVar33 = (ulong *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar33) {
            local_3e8.field_2._M_allocated_capacity = *puVar33;
            local_3e8.field_2._8_8_ = plVar25[3];
          }
          else {
            local_3e8.field_2._M_allocated_capacity = *puVar33;
            local_3e8._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_3e8._M_string_length = plVar25[1];
          *plVar25 = (long)puVar33;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_3e8,(ulong)(pRVar46->name)._M_dataplus._M_p);
          psVar32 = (size_type *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = plVar25[3];
            local_410._M_dataplus._M_p = (pointer)paVar43;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_410._M_string_length = plVar25[1];
          *plVar25 = (long)psVar32;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar43) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p);
          }
          if (local_350 != (TypedID<(spirv_cross::Types)0> *)&local_340) {
            operator_delete(local_350);
          }
          uVar41 = pRVar46->index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001edfd5;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001edfd5;
              }
              if (uVar35 < 10000) goto LAB_001edfd5;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001edfd5:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)paVar43;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        }
        else {
          if (local_3f0->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)local_3f0);
          }
          (*(local_380->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_3e8,local_380,pSVar24,(ulong)local_3c4.id);
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_3e8);
          paVar43 = &local_410.field_2;
          psVar32 = (size_type *)(plVar25 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = plVar25[3];
            local_410._M_dataplus._M_p = (pointer)paVar43;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*plVar25;
          }
          local_410._M_string_length = plVar25[1];
          *plVar25 = (long)psVar32;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::_M_append
                                      ((char *)&local_410,(ulong)(pRVar46->name)._M_dataplus._M_p);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
          if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
            operator_delete((void *)local_3c0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410._M_dataplus._M_p != paVar43) {
            operator_delete(local_410._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p);
          }
          uVar41 = pRVar46->index;
          cVar15 = '\x01';
          if (9 < uVar41) {
            uVar35 = uVar41;
            cVar13 = '\x04';
            do {
              cVar15 = cVar13;
              if (uVar35 < 100) {
                cVar15 = cVar15 + -2;
                goto LAB_001edee1;
              }
              if (uVar35 < 1000) {
                cVar15 = cVar15 + -1;
                goto LAB_001edee1;
              }
              if (uVar35 < 10000) goto LAB_001edee1;
              bVar14 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar13 = cVar15 + '\x04';
            } while (bVar14);
            cVar15 = cVar15 + '\x01';
          }
LAB_001edee1:
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_3e8,cVar15);
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_3e8._M_dataplus._M_p,(uint)local_3e8._M_string_length,uVar41);
          puVar27 = (undefined8 *)
                    ::std::__cxx11::string::replace((ulong)&local_3e8,0,(char *)0x0,0x3064ce);
          psVar32 = puVar27 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar27 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar32) {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410.field_2._8_8_ = puVar27[3];
            local_410._M_dataplus._M_p = (pointer)paVar43;
          }
          else {
            local_410.field_2._M_allocated_capacity = *psVar32;
            local_410._M_dataplus._M_p = (pointer)*puVar27;
          }
          local_410._M_string_length = puVar27[1];
          *puVar27 = psVar32;
          puVar27[1] = 0;
          *(undefined1 *)(puVar27 + 2) = 0;
          plVar25 = (long *)::std::__cxx11::string::append((char *)&local_410);
          local_3c0._0_8_ = local_3b0;
          pSVar18 = (SPIRVariable *)(plVar25 + 2);
          if ((SPIRVariable *)*plVar25 == pSVar18) {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3b0._8_8_ = plVar25[3];
          }
          else {
            local_3b0._0_8_ = (pSVar18->super_IVariant)._vptr_IVariant;
            local_3c0._0_8_ = (SPIRVariable *)*plVar25;
          }
          local_3c0._8_8_ = plVar25[1];
          *plVar25 = (long)pSVar18;
          plVar25[1] = 0;
          *(undefined1 *)(plVar25 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)local_3f0,local_3c0._0_8_);
        }
LAB_001ee0c2:
        if ((SPIRVariable *)local_3c0._0_8_ != (SPIRVariable *)local_3b0) {
          operator_delete((void *)local_3c0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
      }
      pRVar46 = pRVar46 + 1;
    } while ((SPIRVariable *)pRVar46 != local_330);
  }
  SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_248);
  return;
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *discrete_descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	entry_point_bindings.clear();
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);
			uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				if (descriptor_set_is_argument_buffer(desc_set))
				{
					if (is_var_runtime_size_array(var))
					{
						// Runtime arrays need to be wrapped in spvDescriptorArray from argument buffer payload.
						entry_point_bindings.push_back(&var);
						// We'll wrap this, so to_name() will always use non-qualified name.
						// We'll need the qualified name to create temporary variable instead.
						ir.meta[var_id].decoration.qualified_alias_explicit_override = true;
					}
					return;
				}
			}

			// Handle descriptor aliasing of simple discrete cases.
			// We can handle aliasing of buffers by casting pointers.
			// The amount of aliasing we can perform for discrete descriptors is very limited.
			// For fully mutable-style aliasing, we need argument buffers where we can exploit the fact
			// that descriptors are all 8 bytes.
			SPIRVariable *discrete_descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						discrete_descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.discrete_descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars_emulated.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				entry_point_bindings.push_back(&var);
				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), SPIRType::Image,
					                     get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({&var, discrete_descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                     get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!discrete_descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				entry_point_bindings.push_back(&var);
				resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), type.basetype,
				                     resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(),
	            [](const Resource &lhs, const Resource &rhs)
	            { return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index); });

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.discrete_descriptor_alias)
			{
				if (r.var == r.discrete_descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				is_using_builtin_array = true;
				if (is_var_runtime_size_array(var))
				{
					add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
					if (!ep_args.empty())
						ep_args += ", ";
					const bool ssbo = has_decoration(type.self, DecorationBufferBlock);
					if ((var.storage == spv::StorageClassStorageBuffer || ssbo) &&
					    msl_options.runtime_array_rich_descriptor)
					{
						add_spv_func_and_recompile(SPVFuncImplVariableSizedDescriptor);
						ep_args += "const device spvBufferDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					else
					{
						ep_args += "const device spvDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					ep_args += to_restrict(var_id, true) + r.name + "_";
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				else
				{
					uint32_t array_size = get_resource_array_size(type, var_id);
					for (uint32_t i = 0; i < array_size; ++i)
					{
						if (!ep_args.empty())
							ep_args += ", ";
						ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " +
						           to_restrict(var_id, true) + r.name + "_" + convert_to_string(i);
						ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
						if (interlocked_resources.count(var_id))
							ep_args += ", raster_order_group(0)";
						ep_args += "]]";
					}
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += get_argument_address_space(var) + " ";

				if (recursive_inputs.count(type.self))
					ep_args += string("void* ") + to_restrict(var_id, true) + r.name + "_vp";
				else
					ep_args += type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;

				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id, false) + " " + r.name;
			if (is_var_runtime_size_array(var))
				ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")]]";
			else
				ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);

				if (is_var_runtime_size_array(var))
					ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")";
				else
					ep_args += " [[texture(" + convert_to_string(r.index) + ")";

				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars_emulated.count(var.self))
			{
				auto &flags = ir.get_decoration_bitset(var.self);
				const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
				ep_args += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(basetype.image.type), 0));
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
		{
			if (is_var_runtime_size_array(var))
			{
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
				const auto &parent_type = get<SPIRType>(type.parent_type);
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += "const device spvDescriptor<" + type_to_glsl(parent_type) + ">* " +
				           to_restrict(var_id, true) + r.name + "_";
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			break;
		}
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}